

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O1

void __thiscall Fl_Menu_Item_Type::write_code1(Fl_Menu_Item_Type *this)

{
  int iVar1;
  ulong in_RAX;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int n;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pcVar2 = menu_name(this,(int *)((long)&uStack_38 + 4));
  iVar1 = (*((this->super_Fl_Widget_Type).super_Fl_Type.prev)->_vptr_Fl_Type[0x1e])();
  if (iVar1 == 0) {
    pcVar3 = Fl_Type::class_name((Fl_Type *)this,1);
    pcVar6 = "  static Fl_Menu_Item %s[];\n";
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "extern Fl_Menu_Item %s[];\n";
    }
    if (i18n_type != 0) {
      pcVar4 = "  static unsigned char %s_i18n_done;\n";
      if (pcVar3 == (char *)0x0) {
        pcVar4 = "extern unsigned char %s_i18n_done;\n";
      }
      write_h(pcVar4,pcVar2);
    }
    write_h(pcVar6,pcVar2);
  }
  pcVar3 = array_name(&this->super_Fl_Widget_Type);
  if (pcVar3 != (char *)0x0) {
    pcVar6 = Fl_Type::class_name((Fl_Type *)this,1);
    if (pcVar6 == (char *)0x0) {
      if (pcVar3 == (this->super_Fl_Widget_Type).super_Fl_Type.name_) {
        write_h("#define %s (%s+%d)\n",pcVar3,pcVar2,uStack_38 >> 0x20);
        goto LAB_0017ebc9;
      }
      pcVar6 = "extern Fl_Menu_Item *%s;\n";
    }
    else {
      write_public((this->super_Fl_Widget_Type).public_);
      pcVar6 = "  static Fl_Menu_Item *%s;\n";
    }
    write_h(pcVar6,pcVar3);
  }
LAB_0017ebc9:
  pcVar3 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
  if (((pcVar3 != (char *)0x0) && (iVar1 = is_name(pcVar3), iVar1 == 0)) &&
     (pcVar3 = Fl_Type::class_name((Fl_Type *)this,1), pcVar3 != (char *)0x0)) {
    pcVar4 = Fl_Type::callback_name((Fl_Type *)this);
    pcVar3 = (this->super_Fl_Widget_Type).super_Fl_Type.user_data_type_;
    pcVar6 = "void*";
    if (pcVar3 != (char *)0x0) {
      pcVar6 = pcVar3;
    }
    write_public(0);
    write_h("  inline void %s_i(Fl_Menu_*, %s);\n",pcVar4,pcVar6);
    write_h("  static void %s(Fl_Menu_*, %s);\n",pcVar4,pcVar6);
  }
  pcVar3 = (this->super_Fl_Widget_Type).super_Fl_Type.name_;
  if ((pcVar3 != (char *)0x0) && (pcVar3 = strchr(pcVar3,0x5b), pcVar3 != (char *)0x0)) {
    pcVar3 = indent();
    write_c("%s%s = &%s[%d];\n",pcVar3,(this->super_Fl_Widget_Type).super_Fl_Type.name_,pcVar2,
            uStack_38 >> 0x20);
  }
  bVar7 = (this->super_Fl_Widget_Type).image != (Fluid_Image *)0x0;
  if (bVar7) {
    pcVar3 = indent();
    write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n",pcVar3,pcVar2,uStack_38 >> 0x20);
    Fluid_Image::write_code((this->super_Fl_Widget_Type).image,"o",0);
  }
  lVar5 = 0;
  do {
    pcVar3 = (this->super_Fl_Widget_Type).extra_code_[lVar5];
    if ((pcVar3 != (char *)0x0) && (iVar1 = isdeclare(pcVar3), iVar1 == 0)) {
      if (!bVar7) {
        pcVar3 = indent();
        write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n",pcVar3,pcVar2,(ulong)uStack_38._4_4_);
      }
      pcVar3 = indent();
      write_c("%s  %s\n",pcVar3,(this->super_Fl_Widget_Type).extra_code_[lVar5]);
      bVar7 = true;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (!bVar7) {
    return;
  }
  pcVar2 = indent();
  write_c("%s}\n",pcVar2);
  return;
}

Assistant:

void Fl_Menu_Item_Type::write_code1() {
  int i; const char* mname = menu_name(i);

  if (!prev->is_menu_item()) {
    // for first menu item, declare the array
    if (class_name(1)) {
      if (i18n_type) write_h("  static unsigned char %s_i18n_done;\n", mname);
      write_h("  static Fl_Menu_Item %s[];\n", mname);
    } else {
      if (i18n_type) write_h("extern unsigned char %s_i18n_done;\n", mname);
      write_h("extern Fl_Menu_Item %s[];\n", mname);
    }
  }

  const char *c = array_name(this);
  if (c) {
    if (class_name(1)) {
      write_public(public_);
      write_h("  static Fl_Menu_Item *%s;\n", c);
    } else {
      if (c==name())
        write_h("#define %s (%s+%d)\n", c, mname, i);
      else
        write_h("extern Fl_Menu_Item *%s;\n", c);
    }
  }

  if (callback()) {
    if (!is_name(callback()) && class_name(1)) {
      const char* cn = callback_name();
      const char* ut = user_data_type() ? user_data_type() : "void*";
      write_public(0);
      write_h("  inline void %s_i(Fl_Menu_*, %s);\n", cn, ut);
      write_h("  static void %s(Fl_Menu_*, %s);\n", cn, ut);
    }
  }

  int init = 0;
  // if the name is an array variable, assign the value here
  if (name() && strchr(name(), '[')) {
    write_c("%s%s = &%s[%d];\n", indent(), name(), mname, i);
  }
  if (image) {
    if (!init) {
      init = 1;
      write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n", indent(), mname, i);
    }
    image->write_code("o");
  }
  for (int n=0; n < NUM_EXTRA_CODE; n++)
    if (extra_code(n) && !isdeclare(extra_code(n))) {
      if (!init) {
	init = 1;
	write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n", indent(), mname, i);
      }
      write_c("%s  %s\n", indent(), extra_code(n));
    }
  if (init) write_c("%s}\n",indent());
}